

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_util.c
# Opt level: O0

int64_t time_util_hhmmss_ss_to_utime(double time)

{
  ulong uVar1;
  double dVar2;
  uint8_t hours;
  uint8_t minutes;
  double seconds;
  int itime;
  int64_t utime;
  double time_local;
  
  dVar2 = fmod(time,100.0);
  uVar1 = (long)(int)time % 10000;
  return ((long)(int)(((int)time / 10000 & 0xffU) * 360000) +
         (long)(int)((uint)(byte)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 |
                                        uVar1 & 0xffffffff) / 100) * 6000) +
         (long)(dVar2 * 100.0 + 0.0)) * 10000;
}

Assistant:

int64_t time_util_hhmmss_ss_to_utime(double time)
{
    int64_t utime = 0;

    int itime = ((int) time);

    double seconds = fmod(time, 100.0);
    uint8_t minutes = (itime % 10000) / 100;
    uint8_t hours =  itime / 10000;

    utime += seconds *   100;
    utime += minutes *  6000;
    utime += hours   *360000;

    utime *= 10000;

    return utime;
}